

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::ForInit(VM *this,Value *var,Value *limit,Value *step)

{
  RuntimeException *this_00;
  undefined8 uVar1;
  char *v_name;
  long in_RCX;
  int iVar2;
  long in_RDX;
  long in_RSI;
  pair<const_char_*,_int> pVar3;
  pair<const_char_*,_int> pos_2;
  pair<const_char_*,_int> pos_1;
  pair<const_char_*,_int> pos;
  VM *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  RuntimeException *in_stack_ffffffffffffffc0;
  
  if (*(int *)(in_RSI + 8) != 2) {
    pVar3 = GetCurrentInstructionPos(in_stack_ffffffffffffff80);
    this_00 = (RuntimeException *)pVar3.first;
    uVar1 = __cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException
              (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               (Value *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __cxa_throw(uVar1,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  if (*(int *)(in_RDX + 8) != 2) {
    pVar3 = GetCurrentInstructionPos(in_stack_ffffffffffffff80);
    v_name = pVar3.first;
    iVar2 = pVar3.second;
    iVar4 = iVar2;
    uVar1 = __cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               (Value *)CONCAT44(in_stack_ffffffffffffffac,iVar4),v_name,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,iVar2));
    __cxa_throw(uVar1,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  if (*(int *)(in_RCX + 8) != 2) {
    GetCurrentInstructionPos(in_stack_ffffffffffffff80);
    uVar1 = __cxa_allocate_exception(0x20);
    RuntimeException::RuntimeException
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               (Value *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __cxa_throw(uVar1,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  return;
}

Assistant:

void VM::ForInit(Value *var, Value *limit, Value *step)
    {
        if (var->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second,
                                   var, "'for' init", "number");
        }

        if (limit->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second,
                                   limit, "'for' limit", "number");
        }

        if (step->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second,
                                   step, "'for' step", "number");
        }
    }